

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O2

void __thiscall AllRgbWidget::onUpdateFromAlgorithm(AllRgbWidget *this,QImage *allRgb)

{
  QRect local_28;
  
  QImage::copy(&local_28);
  QImage::operator=(&this->allRgb_,(QImage *)&local_28);
  QImage::~QImage((QImage *)&local_28);
  QWidget::update();
  return;
}

Assistant:

void AllRgbWidget::onUpdateFromAlgorithm(QImage allRgb)
{
    allRgb_ = allRgb.copy();
    update();
}